

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ES5ArrayTypeHandler.cpp
# Opt level: O0

uint32 __thiscall
Js::IndexPropertyDescriptorMap::DeleteDownTo(IndexPropertyDescriptorMap *this,uint32 firstKey)

{
  code *pcVar1;
  bool bVar2;
  uint **ppuVar3;
  undefined4 *puVar4;
  nullptr_t local_48;
  nullptr_t local_40;
  undefined1 local_31;
  IndexPropertyDescriptor *pIStack_30;
  bool b;
  IndexPropertyDescriptor *descriptor;
  int local_20;
  uint32 key;
  int i;
  uint32 firstKey_local;
  IndexPropertyDescriptorMap *this_local;
  
  key = firstKey;
  _i = this;
  EnsureIndexList(this);
  local_20 = Count(this);
  while( true ) {
    local_20 = local_20 + -1;
    if (local_20 < 0) {
      return key;
    }
    ppuVar3 = Memory::WriteBarrierPtr::operator_cast_to_unsigned_int__
                        ((WriteBarrierPtr *)&this->indexList);
    descriptor._4_4_ = (*ppuVar3)[local_20];
    if (descriptor._4_4_ < key) break;
    local_31 = TryGetReference(this,descriptor._4_4_,&stack0xffffffffffffffd0);
    if ((!(bool)local_31) || (pIStack_30 == (IndexPropertyDescriptor *)0x0)) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/ES5ArrayTypeHandler.cpp"
                                  ,0xbe,"(b && descriptor)","b && descriptor");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 0;
    }
    if ((pIStack_30->Attributes & 8) == 0) {
      if ((pIStack_30->Attributes & 2) == 0) {
        return descriptor._4_4_ + 1;
      }
      local_40 = (nullptr_t)0x0;
      Memory::WriteBarrierPtr<void>::operator=(&pIStack_30->Getter,&local_40);
      local_48 = (nullptr_t)0x0;
      Memory::WriteBarrierPtr<void>::operator=(&pIStack_30->Setter,&local_48);
      pIStack_30->Attributes = '\x0e';
    }
  }
  return key;
}

Assistant:

uint32 IndexPropertyDescriptorMap::DeleteDownTo(uint32 firstKey)
    {
        EnsureIndexList();

        // Iterate the index list backwards to delete from right to left
        for (int i = Count() - 1; i >= 0; i--)
        {
            uint32 key = indexList[i];
            if (key < firstKey)
            {
                break; // We are done, [firstKey, ...) have already been deleted
            }

            IndexPropertyDescriptor* descriptor;
            bool b = TryGetReference(key, &descriptor);
            Assert(b && descriptor);

            if (descriptor->Attributes & PropertyDeleted)
            {
                continue; // Skip empty entry
            }

            if (descriptor->Attributes & PropertyConfigurable)
            {
                descriptor->Getter = nullptr;
                descriptor->Setter = nullptr;
                descriptor->Attributes = PropertyDeleted | PropertyWritable | PropertyConfigurable;
            }
            else
            {
                // Cannot delete key, and [key + 1, ...) are all deleted
                return key + 1;
            }
        }

        return firstKey;
    }